

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

int tcu::astc::anon_unknown_0::computeNumRequiredBits(ISEParams *iseParams,int numValues)

{
  ISEMode IVar1;
  int iVar2;
  int iVar3;
  
  IVar1 = iseParams->mode;
  if (IVar1 == ISEMODE_PLAIN_BIT) {
    iVar3 = numValues * iseParams->numBits;
  }
  else {
    if (IVar1 == ISEMODE_QUINT) {
      iVar2 = numValues * 7;
      iVar3 = 3;
    }
    else {
      if (IVar1 != ISEMODE_TRIT) {
        return -1;
      }
      iVar2 = numValues * 8;
      iVar3 = 5;
    }
    iVar3 = numValues * iseParams->numBits + ((iVar2 / iVar3 + 1) - (uint)(iVar2 % iVar3 == 0));
  }
  return iVar3;
}

Assistant:

inline int computeNumRequiredBits (const ISEParams& iseParams, int numValues)
{
	switch (iseParams.mode)
	{
		case ISEMODE_TRIT:			return deDivRoundUp32(numValues*8, 5) + numValues*iseParams.numBits;
		case ISEMODE_QUINT:			return deDivRoundUp32(numValues*7, 3) + numValues*iseParams.numBits;
		case ISEMODE_PLAIN_BIT:		return numValues*iseParams.numBits;
		default:
			DE_ASSERT(false);
			return -1;
	}
}